

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zcc_compile.cpp
# Opt level: O0

PSymbolConst * __thiscall ZCCCompiler::CompileConstant(ZCCCompiler *this,ZCC_ConstantDef *def)

{
  bool bVar1;
  PSymbolConstString *this_00;
  PSymbolConstNumeric *pPVar2;
  ZCC_Expression *root;
  PClass *pPVar3;
  PType *node;
  FName local_50;
  undefined1 local_4c [4];
  undefined1 local_48 [20];
  undefined1 local_34 [12];
  ZCC_ExprConstant *cval;
  PSymbolConst *sym;
  ZCC_Expression *val;
  ZCC_ConstantDef *def_local;
  ZCCCompiler *this_local;
  
  val = (ZCC_Expression *)def;
  def_local = (ZCC_ConstantDef *)this;
  if (def->Symbol != (PSymbolConst *)0x0) {
    __assert_fail("def->Symbol == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/zscript/zcc_compile.cpp"
                  ,0xbb,"PSymbolConst *ZCCCompiler::CompileConstant(ZCC_ConstantDef *)");
  }
  def->Symbol = (PSymbolConst *)0x1;
  root = def->Value;
  sym = (PSymbolConst *)Simplify(this,root);
  val->Type = (PType *)sym;
  cval = (ZCC_ExprConstant *)0x0;
  if (*(EZCCTreeNodeType *)((long)&(((PType *)sym)->super_DObject).GCNext + 4) == AST_ExprConstant)
  {
    local_34._4_8_ = sym;
    if (*(PType **)&((PType *)sym)->Align == (PType *)TypeString) {
      this_00 = (PSymbolConstString *)DObject::operator_new((DObject *)0x38,(size_t)root);
      FName::FName((FName *)local_34,val->Operation);
      node = (PType *)local_34;
      PSymbolConstString::PSymbolConstString
                (this_00,(FName *)node,(FString *)*(PType **)(local_34._4_8_ + 0x30));
      cval = (ZCC_ExprConstant *)this_00;
    }
    else {
      pPVar3 = PInt::RegistrationInfo.MyClass;
      bVar1 = DObject::IsA(&(*(PType **)&((PType *)sym)->Align)->super_DObject,
                           PInt::RegistrationInfo.MyClass);
      if (bVar1) {
        pPVar2 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)pPVar3);
        FName::FName((FName *)local_48,val->Operation);
        node = (PType *)local_48;
        PSymbolConstNumeric::PSymbolConstNumeric
                  (pPVar2,(FName *)node,*(PType **)(local_34._4_8_ + 0x28),
                   *(int *)(local_34._4_8_ + 0x30));
        cval = (ZCC_ExprConstant *)pPVar2;
      }
      else {
        pPVar3 = PFloat::RegistrationInfo.MyClass;
        bVar1 = DObject::IsA(&(*(PType **)(local_34._4_8_ + 0x28))->super_DObject,
                             PFloat::RegistrationInfo.MyClass);
        if (bVar1) {
          pPVar2 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)pPVar3);
          FName::FName((FName *)local_4c,val->Operation);
          node = (PType *)local_4c;
          PSymbolConstNumeric::PSymbolConstNumeric
                    (pPVar2,(FName *)node,*(PType **)(local_34._4_8_ + 0x28),
                     (double)*(PType **)(local_34._4_8_ + 0x30));
          cval = (ZCC_ExprConstant *)pPVar2;
        }
        else {
          node = val->Type;
          Error(this,(ZCC_TreeNode *)node,"Bad type for constant definiton");
        }
      }
    }
  }
  else {
    node = val->Type;
    Error(this,(ZCC_TreeNode *)node,"Constant definition requires a constant value");
  }
  if (cval == (ZCC_ExprConstant *)0x0) {
    pPVar2 = (PSymbolConstNumeric *)DObject::operator_new((DObject *)0x38,(size_t)node);
    FName::FName(&local_50,val->Operation);
    PSymbolConstNumeric::PSymbolConstNumeric(pPVar2,&local_50,&TypeError->super_PType,0);
    cval = (ZCC_ExprConstant *)pPVar2;
  }
  val[1].super_ZCC_TreeNode.SiblingNext = (ZCC_TreeNode *)cval;
  PSymbolTable::ReplaceSymbol(this->Symbols,(PSymbol *)cval);
  return (PSymbolConst *)cval;
}

Assistant:

PSymbolConst *ZCCCompiler::CompileConstant(ZCC_ConstantDef *def)
{
	assert(def->Symbol == NULL);

	def->Symbol = DEFINING_CONST;	// avoid recursion
	ZCC_Expression *val = Simplify(def->Value);
	def->Value = val;
	PSymbolConst *sym = NULL;
	if (val->NodeType == AST_ExprConstant)
	{
		ZCC_ExprConstant *cval = static_cast<ZCC_ExprConstant *>(val);
		if (cval->Type == TypeString)
		{
			sym = new PSymbolConstString(def->NodeName, *(cval->StringVal));
		}
		else if (cval->Type->IsA(RUNTIME_CLASS(PInt)))
		{
			sym = new PSymbolConstNumeric(def->NodeName, cval->Type, cval->IntVal);
		}
		else if (cval->Type->IsA(RUNTIME_CLASS(PFloat)))
		{
			sym = new PSymbolConstNumeric(def->NodeName, cval->Type, cval->DoubleVal);
		}
		else
		{
			Error(def->Value, "Bad type for constant definiton");
		}
	}
	else
	{
		Error(def->Value, "Constant definition requires a constant value");
	}
	if (sym == NULL)
	{
		// Create a dummy constant so we don't make any undefined value warnings.
		sym = new PSymbolConstNumeric(def->NodeName, TypeError, 0);
	}
	def->Symbol = sym;
	Symbols->ReplaceSymbol(sym);
	return sym;
}